

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Option *opt_00;
  Mat *pMVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  int iVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  float *pfVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  long lVar37;
  ulong uVar38;
  float fVar39;
  float fVar43;
  float fVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar44 [12];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  long local_310;
  Mat local_308;
  long local_2b8;
  void *local_2b0;
  long local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  Mat local_278;
  undefined1 local_228 [16];
  Option *local_218;
  Mat *local_210;
  Mat local_208;
  Mat local_1b8;
  Mat *local_170;
  size_t local_168;
  Mat *local_160;
  long local_158;
  long local_150;
  undefined1 local_148 [16];
  float afStack_138 [4];
  float afStack_128 [4];
  undefined1 auStack_118 [16];
  float afStack_108 [4];
  float afStack_f8 [32];
  undefined1 auStack_78 [64];
  undefined1 auStack_38 [8];
  
  iVar22 = bottom_blob->c;
  sVar7 = bottom_blob->elemsize;
  iVar6 = bottom_blob->elempack;
  uVar2 = top_blob->w;
  uVar4 = top_blob->h;
  auVar40._4_4_ = uVar4;
  auVar40._0_4_ = uVar2;
  iVar26 = top_blob->c;
  piVar8 = bottom_blob->refcount;
  local_278.data = bottom_blob->data;
  local_278.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_278.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_278.elemsize._0_4_ = (undefined4)sVar7;
  local_278.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
  local_278.allocator = bottom_blob->allocator;
  auVar41._0_4_ = bottom_blob->dims;
  auVar41._4_4_ = bottom_blob->w;
  auVar41._8_4_ = bottom_blob->h;
  auVar41._12_4_ = bottom_blob->d;
  local_278.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  auVar47 = vpcmpeqd_avx(auVar41,auVar41);
  auVar40._8_8_ = 0;
  auVar40 = vpsubd_avx(auVar40,auVar47);
  auVar47 = vpsrld_avx(auVar40,0x1f);
  local_228 = vpaddd_avx(auVar40,auVar47);
  auVar50 = ZEXT1664(local_228);
  auVar47._8_4_ = 0xfffffffe;
  auVar47._0_8_ = 0xfffffffefffffffe;
  auVar47._12_4_ = 0xfffffffe;
  local_148 = vpand_avx(local_228,auVar47);
  local_284 = local_148._0_4_;
  local_288 = local_148._4_4_;
  local_278.elempack = iVar6;
  local_278.dims = auVar41._0_4_;
  local_278.w = auVar41._4_4_;
  local_278.h = auVar41._8_4_;
  local_278.d = auVar41._12_4_;
  local_278.c = iVar22;
  local_170 = bias;
  local_160 = kernel_tm;
  copy_make_border(bottom_blob,&local_278,0,(local_288 - bottom_blob->h) + 2,0,
                   (local_284 - bottom_blob->w) + 2,0,0.0,opt);
  auVar41 = vpsrad_avx(local_228,1);
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elemsize._4_4_ = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  local_280 = iVar26;
  local_27c = iVar6;
  local_218 = opt;
  local_210 = top_blob;
  local_168 = sVar7;
  Mat::create(&local_208,auVar41._4_4_ * auVar41._0_4_,0x10,iVar22,sVar7,iVar6,
              opt->workspace_allocator);
  sVar7 = local_168;
  pMVar20 = local_210;
  opt_00 = local_218;
  iVar6 = local_27c;
  iVar22 = local_280;
  auVar41 = auVar50._0_16_;
  local_2a8 = (long)local_278.c;
  if (0 < local_2a8) {
    local_290 = (ulong)(uint)local_278.w;
    local_2b0 = (void *)(ulong)(uint)local_278.h;
    uVar31 = (local_278.h - ((int)(local_278.h - 2U) >> 0x1f)) + -2 >> 1;
    uVar21 = (local_278.w - ((int)(local_278.w - 2U) >> 0x1f)) + -2 >> 1;
    iVar26 = uVar21 * uVar31;
    uVar38 = 1;
    if (1 < (int)uVar21) {
      uVar38 = (ulong)uVar21;
    }
    if ((int)uVar31 < 2) {
      uVar31 = 1;
    }
    local_298 = (ulong)uVar31;
    local_2a0 = (long)(int)uVar21 * 0x10;
    local_2b8 = (long)(iVar26 * 4) * 4;
    local_158 = (long)(iVar26 * 0xc) * 4;
    local_150 = (long)(iVar26 * 8) * 4;
    local_310 = 0;
    do {
      if (3 < local_278.h) {
        lVar25 = (long)local_278.w *
                 CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize) * 2;
        local_228._0_8_ = lVar25;
        pauVar35 = (undefined1 (*) [16])
                   ((long)local_278.data +
                   CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize) *
                   local_278.cstep * local_310 + 0x30);
        lVar30 = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize) * local_208.cstep
                 * local_310;
        lVar37 = 0;
        uVar27 = 0;
        do {
          if (3 < local_278.w) {
            uVar32 = 0;
            lVar23 = lVar37;
            pauVar24 = pauVar35;
            do {
              lVar36 = -0x40;
              pauVar28 = pauVar24;
              do {
                auVar41 = pauVar28[-2];
                auVar40 = pauVar28[-1];
                auVar47 = vsubps_avx(pauVar28[-3],auVar40);
                auVar52 = vsubps_avx(auVar40,auVar41);
                auVar42 = vsubps_avx(*pauVar28,auVar41);
                *(undefined1 (*) [16])((long)afStack_f8 + lVar36) = auVar47;
                *(float *)((long)afStack_f8 + lVar36 + 0x40) = auVar40._0_4_ + auVar41._0_4_;
                *(float *)((long)afStack_f8 + lVar36 + 0x44) = auVar40._4_4_ + auVar41._4_4_;
                *(float *)((long)afStack_f8 + lVar36 + 0x48) = auVar40._8_4_ + auVar41._8_4_;
                *(float *)((long)afStack_f8 + lVar36 + 0x4c) = auVar40._12_4_ + auVar41._12_4_;
                *(undefined1 (*) [16])(auStack_78 + lVar36) = auVar52;
                *(undefined1 (*) [16])(auStack_38 + lVar36) = auVar42;
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)(local_278.w * 4) * 4);
                lVar36 = lVar36 + 0x10;
              } while (lVar36 != 0);
              lVar29 = 0;
              lVar36 = lVar23;
              do {
                auVar41 = *(undefined1 (*) [16])((long)afStack_128 + lVar29);
                auVar40 = *(undefined1 (*) [16])(auStack_118 + lVar29);
                auVar47 = vsubps_avx(*(undefined1 (*) [16])((long)afStack_138 + lVar29),auVar40);
                auVar52._0_4_ = auVar40._0_4_ + auVar41._0_4_;
                auVar52._4_4_ = auVar40._4_4_ + auVar41._4_4_;
                auVar52._8_4_ = auVar40._8_4_ + auVar41._8_4_;
                auVar52._12_4_ = auVar40._12_4_ + auVar41._12_4_;
                auVar40 = vsubps_avx(auVar40,auVar41);
                auVar41 = vsubps_avx(*(undefined1 (*) [16])((long)afStack_108 + lVar29),auVar41);
                auVar50 = ZEXT1664(auVar41);
                *(undefined1 (*) [16])((long)local_208.data + lVar36 + lVar30) = auVar47;
                *(undefined1 (*) [16])((long)local_208.data + lVar36 + local_2b8 + lVar30) = auVar52
                ;
                *(undefined1 (*) [16])((long)local_208.data + lVar36 + local_150 + lVar30) = auVar40
                ;
                *(undefined1 (*) [16])((long)local_208.data + lVar36 + local_158 + lVar30) = auVar41
                ;
                lVar29 = lVar29 + 0x40;
                lVar36 = lVar36 + (long)(iVar26 * 0x10) * 4;
              } while (lVar29 != 0x100);
              uVar32 = uVar32 + 1;
              pauVar24 = pauVar24 + 2;
              lVar23 = lVar23 + 0x10;
            } while (uVar32 != uVar38);
          }
          uVar27 = uVar27 + 1;
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + lVar25);
          lVar37 = lVar37 + local_2a0;
        } while (uVar27 != local_298);
      }
      auVar41 = auVar50._0_16_;
      local_310 = local_310 + 1;
    } while (local_310 != local_2a8);
  }
  piVar8 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_278.cstep = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  convolution_winograd_dot_pack4_sse(&local_208,iVar22,local_160,&local_1b8,opt_00);
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.allocator = (Allocator *)0x0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  uVar3 = pMVar20->w;
  uVar5 = pMVar20->h;
  auVar42._4_4_ = uVar5;
  auVar42._0_4_ = uVar3;
  auVar42._8_8_ = 0;
  auVar40 = vpcmpeqd_avx(auVar42,local_148);
  auVar40 = vpmovsxdq_avx(auVar40);
  auVar41 = vpcmpeqd_avx(auVar41,auVar41);
  if (((auVar41 & ~auVar40) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar41 & ~auVar40,0xf)) {
    if (&local_308 != pMVar20) {
      piVar8 = pMVar20->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_308.data = pMVar20->data;
      local_308.refcount._0_4_ = SUB84(pMVar20->refcount,0);
      local_308.refcount._4_4_ = (undefined4)((ulong)pMVar20->refcount >> 0x20);
      local_308.elemsize._0_4_ = (undefined4)pMVar20->elemsize;
      local_308.elemsize._4_4_ = (undefined4)(pMVar20->elemsize >> 0x20);
      local_308.elempack = pMVar20->elempack;
      local_308.allocator = pMVar20->allocator;
      uVar16 = pMVar20->dims;
      uVar17 = pMVar20->w;
      uVar18 = pMVar20->h;
      uVar19 = pMVar20->d;
      local_308.c = pMVar20->c;
      local_308.cstep = pMVar20->cstep;
      local_308.dims = uVar16;
      local_308.w = uVar17;
      local_308.h = uVar18;
      local_308.d = uVar19;
    }
  }
  else {
    Mat::create(&local_308,local_284,local_288,iVar22,sVar7,iVar6,opt_00->workspace_allocator);
  }
  local_2a8 = (long)local_308.c;
  if (0 < local_2a8) {
    local_2b0 = local_170->data;
    local_290 = (ulong)(uint)local_308.w;
    local_2b8 = CONCAT44(local_2b8._4_4_,local_308.h);
    local_298 = (ulong)(uint)(local_308.h / 2);
    uVar31 = local_308.w / 2;
    iVar22 = uVar31 * (local_308.h / 2);
    local_2a0 = (ulong)uVar31 * 4;
    lVar25 = 0;
    do {
      if (local_2b0 == (void *)0x0) {
        fVar39 = 0.0;
        fVar43 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
      }
      else {
        pfVar33 = (float *)((long)local_2b0 + lVar25 * 0x10);
        fVar39 = *pfVar33;
        fVar43 = pfVar33[1];
        fVar45 = pfVar33[2];
        fVar46 = pfVar33[3];
      }
      if (1 < local_308.h) {
        lVar30 = (long)local_308.w *
                 CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize) * 2;
        local_228._0_8_ = lVar30;
        pauVar35 = (undefined1 (*) [16])
                   ((long)local_308.data +
                   CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize) *
                   local_308.cstep * lVar25 + 0x10);
        uVar27 = 0;
        uVar38 = 0;
        do {
          if (1 < local_308.w) {
            uVar34 = 0;
            pauVar24 = pauVar35;
            uVar32 = uVar27;
            do {
              pfVar33 = (float *)((long)local_1b8.data +
                                 (uVar32 >> 2 & 0x3fffffff) * 0x10 +
                                 local_1b8.elemsize * local_1b8.cstep * lVar25);
              lVar37 = -0x40;
              do {
                auVar41 = *(undefined1 (*) [16])(pfVar33 + iVar22 * 4);
                auVar40 = *(undefined1 (*) [16])(pfVar33 + iVar22 * 8);
                fVar9 = pfVar33[1];
                fVar10 = pfVar33[2];
                fVar11 = pfVar33[3];
                auVar47 = vsubps_avx(auVar41,auVar40);
                pfVar1 = pfVar33 + iVar22 * 0xc;
                fVar12 = *pfVar1;
                fVar13 = pfVar1[1];
                fVar14 = pfVar1[2];
                fVar15 = pfVar1[3];
                *(float *)((long)afStack_f8 + lVar37) = auVar41._0_4_ + *pfVar33 + auVar40._0_4_;
                *(float *)((long)afStack_f8 + lVar37 + 4) = auVar41._4_4_ + fVar9 + auVar40._4_4_;
                *(float *)((long)afStack_f8 + lVar37 + 8) = auVar41._8_4_ + fVar10 + auVar40._8_4_;
                *(float *)((long)afStack_f8 + lVar37 + 0xc) =
                     auVar41._12_4_ + fVar11 + auVar40._12_4_;
                *(float *)((long)afStack_f8 + lVar37 + 0x40) = auVar47._0_4_ + fVar12;
                *(float *)((long)afStack_f8 + lVar37 + 0x44) = auVar47._4_4_ + fVar13;
                *(float *)((long)afStack_f8 + lVar37 + 0x48) = auVar47._8_4_ + fVar14;
                *(float *)((long)afStack_f8 + lVar37 + 0x4c) = auVar47._12_4_ + fVar15;
                pfVar33 = pfVar33 + iVar22 * 0x10;
                lVar37 = lVar37 + 0x10;
              } while (lVar37 != 0);
              lVar37 = 0;
              pauVar28 = pauVar24;
              do {
                auVar48._0_4_ = fVar39 + *(float *)((long)afStack_128 + lVar37);
                auVar48._4_4_ = fVar43 + *(float *)((long)afStack_128 + lVar37 + 4);
                auVar48._8_4_ = fVar45 + *(float *)((long)afStack_128 + lVar37 + 8);
                auVar48._12_4_ = fVar46 + *(float *)((long)afStack_128 + lVar37 + 0xc);
                auVar41 = *(undefined1 (*) [16])(auStack_118 + lVar37);
                auVar51._0_4_ =
                     auVar48._0_4_ + *(float *)((long)afStack_138 + lVar37) + auVar41._0_4_;
                auVar51._4_4_ =
                     auVar48._4_4_ + *(float *)((long)afStack_138 + lVar37 + 4) + auVar41._4_4_;
                auVar51._8_4_ =
                     auVar48._8_4_ + *(float *)((long)afStack_138 + lVar37 + 8) + auVar41._8_4_;
                auVar51._12_4_ =
                     auVar48._12_4_ + *(float *)((long)afStack_128 + lVar37 + -4) + auVar41._12_4_;
                auVar41 = vsubps_avx(auVar48,auVar41);
                auVar49._0_4_ = auVar41._0_4_ + *(float *)((long)afStack_108 + lVar37);
                auVar49._4_4_ = auVar41._4_4_ + *(float *)((long)afStack_108 + lVar37 + 4);
                auVar49._8_4_ = auVar41._8_4_ + *(float *)((long)afStack_108 + lVar37 + 8);
                auVar49._12_4_ = auVar41._12_4_ + *(float *)((long)afStack_108 + lVar37 + 0xc);
                pauVar28[-1] = auVar51;
                *pauVar28 = auVar49;
                lVar37 = lVar37 + 0x40;
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)(local_308.w * 4) * 4);
              } while (lVar37 == 0x40);
              uVar34 = uVar34 + 1;
              uVar32 = uVar32 + 4;
              pauVar24 = pauVar24 + 2;
            } while (uVar34 != uVar31);
          }
          uVar38 = uVar38 + 1;
          uVar27 = uVar27 + local_2a0;
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + lVar30);
        } while (uVar38 != local_298);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != local_2a8);
  }
  copy_cut_border(&local_308,local_210,0,local_308.h - local_210->h,0,local_308.w - local_210->w,
                  local_218);
  piVar8 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_308.allocator == (Allocator *)0x0) {
        if (local_308.data != (void *)0x0) {
          free(local_308.data);
        }
      }
      else {
        (*(local_308.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_308.cstep = 0;
  auVar44 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  piVar8 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
          auVar44 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        auVar44 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
      }
    }
  }
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = auVar44._4_4_;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = auVar44._0_8_;
  local_1b8.elempack = auVar44._8_4_;
  local_1b8.w = 0;
  local_1b8._48_8_ = auVar44._4_8_;
  local_1b8.c = 0;
  piVar8 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
  local_1b8.dims = local_1b8.refcount._4_4_;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elemsize._4_4_ = 0;
  local_208.elempack = 0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  piVar8 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}